

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O3

QItemSelection *
mergeIndexes(QItemSelection *__return_storage_ptr__,QList<QPersistentModelIndex> *indexes)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QPersistentModelIndex *pQVar5;
  long lVar6;
  ulong uVar7;
  QPersistentModelIndex *this;
  long lVar8;
  long in_FS_OFFSET;
  QPersistentModelIndex br;
  int local_110;
  undefined8 local_108;
  long local_100;
  long lStack_f8;
  QPersistentModelIndex local_f0;
  long local_e8;
  long lStack_e0;
  QItemSelectionRange local_d8;
  QAbstractItemModel *local_c8;
  QModelIndex local_b8;
  undefined8 local_98;
  QPersistentModelIndexData *pQStack_90;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_88;
  QModelIndex local_78;
  QArrayDataPointer<QItemSelectionRange> local_58;
  QItemSelection *local_38;
  
  local_38 = *(QItemSelection **)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (QItemSelectionRange *)0x0;
  local_58.size = 0;
  uVar7 = 0;
  if ((indexes->d).size != 0) {
    lVar8 = 0;
    do {
      this = (indexes->d).ptr + lVar8;
      bVar1 = QPersistentModelIndex::isValid(this);
      if (bVar1) {
        local_f0.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::QPersistentModelIndex(&local_f0,this);
        local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::parent(&local_78,&local_f0);
        iVar2 = QPersistentModelIndex::row(&local_f0);
        local_110 = QPersistentModelIndex::column(&local_f0);
        uVar7 = (ulong)(int)uVar7;
        while( true ) {
          lVar8 = uVar7 << 3;
          do {
            lVar6 = lVar8;
            uVar7 = uVar7 + 1;
            if ((indexes->d).size <= (long)uVar7) goto LAB_0045d442;
            pQVar5 = (indexes->d).ptr;
            bVar1 = QPersistentModelIndex::isValid
                              ((QPersistentModelIndex *)((long)&pQVar5[1].d + lVar6));
            lVar8 = lVar6 + 8;
          } while (!bVar1);
          local_88.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_98 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
          pQStack_90 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
          pQVar5 = (QPersistentModelIndex *)((long)&pQVar5[1].d + lVar6);
          QPersistentModelIndex::parent((QModelIndex *)&local_98,pQVar5);
          iVar3 = QPersistentModelIndex::row(pQVar5);
          iVar4 = QPersistentModelIndex::column(pQVar5);
          if ((int)local_98 != local_78.r) break;
          if ((((local_98._4_4_ != local_78.c) ||
               (pQStack_90 != (QPersistentModelIndexData *)local_78.i)) ||
              (local_88.ptr != local_78.m.ptr)) || ((iVar3 != iVar2 || (iVar4 != local_110 + 1))))
          break;
          QPersistentModelIndex::operator=(&local_f0,pQVar5);
          local_78.m.ptr = local_88.ptr;
          local_78._0_8_ = local_98;
          local_78.i = (quintptr)pQStack_90;
          local_110 = iVar4;
        }
LAB_0045d442:
        QPersistentModelIndex::operator_cast_to_QModelIndex(this);
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_f0);
        QItemSelectionRange::QItemSelectionRange(&local_d8,(QModelIndex *)&local_98,&local_b8);
        QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                  ((QMovableArrayOps<QItemSelectionRange> *)&local_58,local_58.size,&local_d8);
        QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_58);
        QPersistentModelIndex::~QPersistentModelIndex(&local_d8.br);
        QPersistentModelIndex::~QPersistentModelIndex(&local_d8.tl);
        QPersistentModelIndex::~QPersistentModelIndex(&local_f0);
      }
      else {
        uVar7 = (ulong)((int)uVar7 + 1);
      }
      lVar8 = (long)(int)uVar7;
    } while (lVar8 < (indexes->d).size);
  }
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.d = (Data *)0x0;
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.ptr = (QItemSelectionRange *)0x0;
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.size = 0;
  if (local_58.size != 0) {
    lVar8 = 0;
    iVar2 = 0;
    do {
      local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58.ptr[lVar8].tl);
      local_88.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_98 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      pQStack_90 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58.ptr[lVar8].br);
      iVar2 = iVar2 + 1;
      lVar8 = (long)iVar2;
      if (lVar8 < local_58.size) {
        iVar2 = local_78.c;
        lVar6 = lVar8 << 4;
        iVar3 = local_78.r;
        while( true ) {
          local_b8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_b8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    ((QPersistentModelIndex *)((long)&((local_58.ptr)->tl).d + lVar6));
          local_c8 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_d8.tl.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
          local_d8.br.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    ((QPersistentModelIndex *)((long)&((local_58.ptr)->br).d + lVar6));
          if (local_b8.m.ptr == (QAbstractItemModel *)0x0) {
            local_f0.d = (QPersistentModelIndexData *)0xffffffffffffffff;
            local_e8 = 0;
            lStack_e0 = 0;
          }
          else {
            (*((local_b8.m.ptr)->super_QObject)._vptr_QObject[0xd])
                      (&local_f0,local_b8.m.ptr,(QItemSelectionRange *)&local_b8);
          }
          if (local_78.m.ptr == (QAbstractItemModel *)0x0) {
            local_108 = 0xffffffffffffffff;
            local_100 = 0;
            lStack_f8 = 0;
            local_108._0_4_ = -1;
          }
          else {
            (*((local_78.m.ptr)->super_QObject)._vptr_QObject[0xd])
                      (&local_108,local_78.m.ptr,&local_78);
          }
          if ((int)local_f0.d != (int)local_108) break;
          if (((local_f0.d._4_4_ != local_108._4_4_) || (local_e8 != local_100)) ||
             ((lStack_e0 != lStack_f8 || (local_b8.c != iVar2)))) break;
          if ((local_d8.tl.d._4_4_ != local_98._4_4_) || (local_b8.r != iVar3 + 1)) break;
          if ((int)local_d8.tl.d != (int)local_98 + 1) break;
          local_88.ptr = local_c8;
          local_98 = local_d8.tl.d;
          pQStack_90 = local_d8.br.d;
          lVar8 = lVar8 + 1;
          lVar6 = lVar6 + 0x10;
          iVar3 = local_b8.r;
          if (local_58.size <= lVar8) break;
        }
        iVar2 = (int)lVar8;
      }
      QItemSelectionRange::QItemSelectionRange
                ((QItemSelectionRange *)&local_b8,&local_78,(QModelIndex *)&local_98);
      QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                ((QMovableArrayOps<QItemSelectionRange> *)__return_storage_ptr__,
                 (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.size,
                 (QItemSelectionRange *)&local_b8);
      QList<QItemSelectionRange>::end(&__return_storage_ptr__->super_QList<QItemSelectionRange>);
      QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_b8.i);
      QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_b8);
      lVar8 = (long)iVar2;
    } while (lVar8 < local_58.size);
  }
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_58);
  if (*(QItemSelection **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(QItemSelection **)(in_FS_OFFSET + 0x28);
}

Assistant:

static QItemSelection mergeIndexes(const QList<QPersistentModelIndex> &indexes)
{
    QItemSelection colSpans;
    // merge columns
    int i = 0;
    while (i < indexes.size()) {
        const QPersistentModelIndex &tl = indexes.at(i);
        if (!tl.isValid()) {
            ++i;
            continue;
        }
        QPersistentModelIndex br = tl;
        QModelIndex brParent = br.parent();
        int brRow = br.row();
        int brColumn = br.column();
        while (++i < indexes.size()) {
            const QPersistentModelIndex &next = indexes.at(i);
            if (!next.isValid())
                continue;
            const QModelIndex nextParent = next.parent();
            const int nextRow = next.row();
            const int nextColumn = next.column();
            if ((nextParent == brParent)
                 && (nextRow == brRow)
                 && (nextColumn == brColumn + 1)) {
                br = next;
                brParent = nextParent;
                brRow = nextRow;
                brColumn = nextColumn;
            } else {
                break;
            }
        }
        colSpans.append(QItemSelectionRange(tl, br));
    }
    // merge rows
    QItemSelection rowSpans;
    i = 0;
    while (i < colSpans.size()) {
        QModelIndex tl = colSpans.at(i).topLeft();
        QModelIndex br = colSpans.at(i).bottomRight();
        QModelIndex prevTl = tl;
        while (++i < colSpans.size()) {
            QModelIndex nextTl = colSpans.at(i).topLeft();
            QModelIndex nextBr = colSpans.at(i).bottomRight();

            if (nextTl.parent() != tl.parent())
                break; // we can't merge selection ranges from different parents

            if ((nextTl.column() == prevTl.column()) && (nextBr.column() == br.column())
                && (nextTl.row() == prevTl.row() + 1) && (nextBr.row() == br.row() + 1)) {
                br = nextBr;
                prevTl = nextTl;
            } else {
                break;
            }
        }
        rowSpans.append(QItemSelectionRange(tl, br));
    }
    return rowSpans;
}